

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metrics.c
# Opt level: O3

unsigned_long total_jiffies_func(void)

{
  byte *pbVar1;
  uint uVar2;
  char *pcVar3;
  ushort **ppuVar4;
  unsigned_long uVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  sensor_slurp proc_stat;
  char *local_2048;
  ulong local_2040;
  undefined1 local_2038 [8];
  char local_2030 [8192];
  
  memcpy(local_2038,&PTR_anon_var_dwarf_3da67_00161aa0,0x2008);
  slurpfile("/proc/stat",local_2030,0x2000);
  pcVar3 = skip_token(local_2030);
  ppuVar4 = __ctype_b_loc();
  local_2048 = pcVar3 + -1;
  do {
    pbVar1 = (byte *)(local_2048 + 1);
    local_2048 = local_2048 + 1;
  } while ((*(byte *)((long)*ppuVar4 + (ulong)*pbVar1 * 2 + 1) & 0x20) != 0);
  dVar6 = strtod(local_2048,&local_2048);
  local_2048 = local_2048 + -1;
  do {
    pbVar1 = (byte *)(local_2048 + 1);
    local_2048 = local_2048 + 1;
  } while ((*(byte *)((long)*ppuVar4 + (ulong)*pbVar1 * 2 + 1) & 0x20) != 0);
  dVar7 = strtod(local_2048,&local_2048);
  local_2048 = local_2048 + -1;
  do {
    pbVar1 = (byte *)(local_2048 + 1);
    local_2048 = local_2048 + 1;
  } while ((*(byte *)((long)*ppuVar4 + (ulong)*pbVar1 * 2 + 1) & 0x20) != 0);
  dVar8 = strtod(local_2048,&local_2048);
  local_2048 = local_2048 + -1;
  do {
    pbVar1 = (byte *)(local_2048 + 1);
    local_2048 = local_2048 + 1;
  } while ((*(byte *)((long)*ppuVar4 + (ulong)*pbVar1 * 2 + 1) & 0x20) != 0);
  dVar9 = strtod(local_2048,&local_2048);
  uVar2 = num_cpustates_func();
  if (uVar2 == 4) {
    uVar5 = ((long)dVar7 & 0xffffffffU) + ((long)dVar6 & 0xffffffffU) + ((long)dVar8 & 0xffffffffU)
            + ((long)dVar9 & 0xffffffffU);
  }
  else {
    local_2048 = local_2048 + -1;
    do {
      pbVar1 = (byte *)(local_2048 + 1);
      local_2048 = local_2048 + 1;
    } while ((*(byte *)((long)*ppuVar4 + (ulong)*pbVar1 * 2 + 1) & 0x20) != 0);
    local_2040 = (long)dVar6 & 0xffffffffU;
    dVar6 = strtod(local_2048,&local_2048);
    local_2048 = local_2048 + -1;
    do {
      pbVar1 = (byte *)(local_2048 + 1);
      local_2048 = local_2048 + 1;
    } while ((*(byte *)((long)*ppuVar4 + (ulong)*pbVar1 * 2 + 1) & 0x20) != 0);
    dVar10 = strtod(local_2048,&local_2048);
    local_2048 = local_2048 + -1;
    do {
      pbVar1 = (byte *)(local_2048 + 1);
      local_2048 = local_2048 + 1;
    } while ((*(byte *)((long)*ppuVar4 + (ulong)*pbVar1 * 2 + 1) & 0x20) != 0);
    dVar11 = strtod(local_2048,&local_2048);
    uVar5 = ((long)dVar7 & 0xffffffffU) + local_2040 + ((long)dVar8 & 0xffffffffU) +
            ((long)dVar9 & 0xffffffffU) + ((long)dVar10 & 0xffffffffU) + ((long)dVar6 & 0xffffffffU)
            + ((long)dVar11 & 0xffffffffU);
  }
  return uVar5;
}

Assistant:

unsigned long total_jiffies_func ( void ) {

   char *p;
   unsigned long user_jiffies, nice_jiffies, system_jiffies, idle_jiffies,
                 wio_jiffies, irq_jiffies, sirq_jiffies;
	
   sensor_slurp proc_stat = { "/proc/stat" };
   p = update_file(&proc_stat);
   p = skip_token(p);
   p = skip_whitespace(p);
   user_jiffies = (unsigned int)strtod( p, &p );
   p = skip_whitespace(p);
   nice_jiffies = (unsigned int)strtod( p, &p ); 
   p = skip_whitespace(p);
   system_jiffies = (unsigned int)strtod( p , &p ); 
   p = skip_whitespace(p);
   idle_jiffies = (unsigned int)strtod( p , &p );

   int num_cpustates = num_cpustates_func();
   if(num_cpustates == 4) /*NUM_CPUSTATES_24X*/
       return user_jiffies + nice_jiffies + system_jiffies + idle_jiffies;

   p = skip_whitespace(p);
   wio_jiffies = (unsigned int)strtod( p , &p );
   p = skip_whitespace(p);
   irq_jiffies = (unsigned int)strtod( p , &p );
   p = skip_whitespace(p);
   sirq_jiffies = (unsigned int)strtod( p , &p );
  
   return user_jiffies + nice_jiffies + system_jiffies + idle_jiffies +
          wio_jiffies + irq_jiffies + sirq_jiffies; 
}